

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  xpath_value_type xVar1;
  xpath_memory_block *pxVar2;
  double *pdVar3;
  uint uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  xpath_ast_node *pxVar8;
  double *pdVar9;
  xml_attribute_struct *pxVar10;
  char_t *pcVar11;
  byte *pbVar12;
  size_t sVar13;
  ulong uVar14;
  undefined1 *puVar15;
  xml_attribute xVar16;
  char *pcVar17;
  xpath_allocator *pxVar18;
  byte *pbVar19;
  uint uVar20;
  long lVar21;
  xpath_memory_block *pxVar22;
  char *pcVar23;
  char_t *begin;
  byte bVar24;
  char cVar25;
  xml_node xVar26;
  undefined1 *puVar27;
  byte *pbVar28;
  byte *pbVar29;
  long lVar30;
  long lVar31;
  size_t sVar32;
  double dVar33;
  xml_node_struct *pxVar34;
  xml_node xVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  xpath_node xVar38;
  double v;
  size_t local_c0;
  char_t *local_b0;
  undefined1 local_a8 [8];
  xml_attribute xStack_a0;
  xml_attribute_struct *local_98;
  xml_node local_88;
  double *local_80;
  undefined1 local_78 [16];
  ulong local_68;
  undefined1 local_60 [16];
  size_t local_50;
  xpath_allocator *local_48;
  xpath_stack local_40;
  
  uVar5 = local_78._8_8_;
LAB_00385df4:
  local_78._8_8_ = uVar5;
  switch(this->_type) {
  case '\x12':
    pcVar17 = (char *)this->_data;
    break;
  case '\x14':
    xVar1 = ((this->_data).variable)->_type;
    if (xVar1 != (int)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2b11,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x03') {
      if (xVar1 == xpath_type_string) {
        pcVar17 = *(char **)((this->_data).variable + 1);
      }
      else {
        pcVar17 = (char *)0x0;
      }
      pcVar23 = "";
      if (pcVar17 != (char *)0x0) {
        pcVar23 = pcVar17;
      }
      __return_storage_ptr__->_buffer = pcVar23;
      goto LAB_00386d07;
    }
  default:
    cVar25 = this->_rettype;
    if (cVar25 == '\x01') {
      xVar26._root = (xml_node_struct *)stack->temp;
      pxVar22 = (xpath_memory_block *)(xVar26._root)->header;
      pcVar11 = (xVar26._root)->name;
      local_60._8_8_ = (xml_attribute_struct *)stack->result;
      local_60._0_8_ = xVar26._root;
      eval_node_set((xpath_node_set_raw *)local_a8,this,c,(xpath_stack *)local_60,nodeset_eval_first
                   );
      if (xStack_a0._attr == local_98) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
      }
      else {
        local_78 = (undefined1  [16])
                   xpath_first((xpath_node *)xStack_a0._attr,(xpath_node *)local_98,local_a8._0_4_);
        string_value(__return_storage_ptr__,(xpath_node *)local_78,stack->result);
      }
      pxVar2 = (xpath_memory_block *)(xVar26._root)->header;
      while (pxVar2 != pxVar22) {
        pxVar2 = pxVar2->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      (xVar26._root)->header = (uintptr_t)pxVar22;
      (xVar26._root)->name = pcVar11;
      return __return_storage_ptr__;
    }
    if (cVar25 != '\x02') {
      if (cVar25 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2b32,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar6 = eval_boolean(this,c,stack);
      pcVar17 = "false";
      if (bVar6) {
        pcVar17 = "true";
      }
      __return_storage_ptr__->_buffer = pcVar17;
      goto LAB_00386d07;
    }
    pxVar34 = (xml_node_struct *)eval_number(this,c,stack);
    pxVar18 = stack->result;
    if (((double)pxVar34 != 0.0) || (NAN((double)pxVar34))) {
      if (NAN((double)pxVar34)) {
        pcVar17 = "NaN";
      }
      else if (((double)pxVar34 + (double)pxVar34 != (double)pxVar34) ||
              (NAN((double)pxVar34 + (double)pxVar34) || NAN((double)pxVar34))) {
        pcVar17 = (char *)0x0;
      }
      else {
        pcVar17 = "-Infinity";
        if (0.0 < (double)pxVar34) {
          pcVar17 = "Infinity";
        }
      }
    }
    else {
      pcVar17 = "0";
    }
    if (pcVar17 != (char *)0x0) break;
    local_a8 = (undefined1  [8])pxVar34;
    snprintf(local_a8,0x20,"%.*e",0xf);
    pbVar12 = (byte *)strchr(local_a8,0x65);
    if (pbVar12 == (byte *)0x0) {
      __assert_fail("exponent_string",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2107,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    iVar7 = atoi((char *)(pbVar12 + 1));
    uVar14 = (ulong)(local_a8[0] == 0x2d);
    if ((local_a8[uVar14] == 0x30) || ((local_a8[uVar14 + 1] | 2) != 0x2e)) {
      __assert_fail("mantissa[0] != \'0\' && (mantissa[1] == \'.\' || mantissa[1] == \',\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x210d,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    pbVar19 = local_a8 + uVar14 + 1;
    *pbVar19 = local_a8[uVar14];
    goto LAB_00386c42;
  case '\x19':
    local_a8 = (undefined1  [8])(c->n)._node._root;
    xStack_a0._attr = (c->n)._attribute._attr;
    pcVar17 = local_name((xpath_node *)local_a8);
    break;
  case '\x1a':
    pxVar18 = stack->result;
    pxVar22 = pxVar18->_root;
    local_c0 = pxVar18->_root_size;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_60 = (undefined1  [16])
               xpath_first((xpath_node *)xStack_a0._attr,(xpath_node *)local_98,local_a8._0_4_);
    pcVar11 = local_name((xpath_node *)local_60);
    __return_storage_ptr__->_buffer = pcVar11;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar2 = pxVar18->_root;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    goto LAB_003860b7;
  case '\x1b':
    local_a8 = (undefined1  [8])(c->n)._node._root;
    xStack_a0._attr = (c->n)._attribute._attr;
    pcVar17 = namespace_uri((xpath_node *)local_a8);
    break;
  case '\x1c':
    pxVar18 = stack->result;
    pxVar22 = pxVar18->_root;
    local_c0 = pxVar18->_root_size;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_60 = (undefined1  [16])
               xpath_first((xpath_node *)xStack_a0._attr,(xpath_node *)local_98,local_a8._0_4_);
    pcVar11 = namespace_uri((xpath_node *)local_60);
    __return_storage_ptr__->_buffer = pcVar11;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar2 = pxVar18->_root;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
LAB_003860b7:
    pxVar18->_root = pxVar22;
    pxVar18->_root_size = local_c0;
    return __return_storage_ptr__;
  case '\x1d':
    pxVar34 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar34 == (xml_node_struct *)0x0) &&
       (pxVar34 = (c->n)._node._root, pxVar34 == (xml_node_struct *)0x0)) goto LAB_00386cfc;
    pcVar17 = "";
    if (pxVar34->name != (char *)0x0) {
      pcVar17 = pxVar34->name;
    }
    break;
  case '\x1e':
    pxVar18 = stack->result;
    pxVar22 = pxVar18->_root;
    sVar32 = pxVar18->_root_size;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    xVar38 = xpath_first((xpath_node *)xStack_a0._attr,(xpath_node *)local_98,local_a8._0_4_);
    xVar16._attr = xVar38._attribute._attr._attr;
    if ((xVar38._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar16._attr = (xml_attribute_struct *)xVar38._node._root._root,
       xVar38._node._root._root == (xml_node_struct *)0x0)) {
      pcVar17 = "";
    }
    else {
      pcVar17 = "";
      if (((xml_node_struct *)xVar16._attr)->name != (char *)0x0) {
        pcVar17 = ((xml_node_struct *)xVar16._attr)->name;
      }
    }
    __return_storage_ptr__->_buffer = pcVar17;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar2 = pxVar18->_root;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar18->_root = pxVar22;
    pxVar18->_root_size = sVar32;
    return __return_storage_ptr__;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_00385e0c_caseD_20;
  case '!':
    pxVar18 = stack->temp;
    lVar30 = 1;
    for (pxVar8 = this->_right; pxVar8 != (xpath_ast_node *)0x0; pxVar8 = pxVar8->_next) {
      lVar30 = lVar30 + 1;
    }
    pxVar22 = pxVar18->_root;
    local_88._root = (xml_node_struct *)pxVar18->_root_size;
    pdVar9 = (double *)xpath_allocator::allocate(pxVar18,lVar30 * 0x18);
    if (pdVar9 == (double *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
      xVar26._root = local_88._root;
    }
    else {
      local_60._8_8_ = (xml_attribute_struct *)stack->result;
      local_60._0_8_ = (xml_node_struct *)stack->temp;
      local_48 = pxVar18;
      eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
      pdVar9[2] = (double)local_98;
      *pdVar9 = (double)local_a8;
      pdVar9[1] = (double)xStack_a0._attr;
      pxVar8 = this->_right;
      local_80 = pdVar9;
      if (pxVar8 == (xpath_ast_node *)0x0) {
        lVar21 = 1;
      }
      else {
        lVar21 = 1;
        do {
          eval_string((xpath_string *)local_a8,pxVar8,c,(xpath_stack *)local_60);
          pdVar9[5] = (double)local_98;
          pdVar9[3] = (double)local_a8;
          pdVar9[4] = (double)xStack_a0._attr;
          lVar21 = lVar21 + 1;
          pxVar8 = pxVar8->_next;
          pdVar9 = pdVar9 + 3;
        } while (pxVar8 != (xpath_ast_node *)0x0);
      }
      if (lVar21 != lVar30) {
        __assert_fail("pos == count",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2a2f,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                     );
      }
      if (lVar30 == 0) {
        sVar32 = 1;
      }
      else {
        pdVar9 = local_80 + 2;
        lVar31 = 0;
        lVar21 = lVar30;
        do {
          if (*(char *)(pdVar9 + -1) == '\x01') {
            dVar33 = *pdVar9;
          }
          else {
            dVar33 = (double)strlength((char_t *)pdVar9[-2]);
          }
          lVar31 = lVar31 + (long)dVar33;
          pdVar9 = pdVar9 + 3;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        sVar32 = lVar31 + 1;
      }
      pcVar11 = (char_t *)xpath_allocator::allocate(stack->result,sVar32);
      pxVar18 = local_48;
      xVar26._root = local_88._root;
      if (pcVar11 == (char_t *)0x0) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
      }
      else {
        pcVar17 = pcVar11;
        if (lVar30 != 0) {
          lVar21 = 0;
          do {
            pcVar23 = (char *)local_80[lVar21 * 3];
            cVar25 = *pcVar23;
            while (cVar25 != '\0') {
              pcVar23 = pcVar23 + 1;
              *pcVar17 = cVar25;
              pcVar17 = pcVar17 + 1;
              cVar25 = *pcVar23;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != lVar30);
        }
        *pcVar17 = '\0';
        xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar11,pcVar17);
      }
    }
    pxVar2 = pxVar18->_root;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar18->_root = pxVar22;
    pxVar18->_root_size = (size_t)xVar26._root;
    return __return_storage_ptr__;
  case '$':
    xVar26._root = (xml_node_struct *)stack->temp;
    pxVar22 = (xpath_memory_block *)(xVar26._root)->header;
    local_b0 = (xVar26._root)->name;
    local_78._8_8_ = (xml_attribute_struct *)stack->result;
    local_78._0_8_ = xVar26._root;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_78);
    eval_string((xpath_string *)local_60,this->_right,c,(xpath_stack *)local_78);
    pcVar17 = strstr((char *)local_a8,(char *)local_60._0_8_);
    if (pcVar17 == (char *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      xpath_string::from_heap(__return_storage_ptr__,(char_t *)local_a8,pcVar17,stack->result);
    }
    pxVar2 = (xpath_memory_block *)(xVar26._root)->header;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    (xVar26._root)->header = (uintptr_t)pxVar22;
    goto LAB_00386903;
  case '%':
    xVar26._root = (xml_node_struct *)stack->temp;
    pxVar22 = (xpath_memory_block *)(xVar26._root)->header;
    local_b0 = (xVar26._root)->name;
    local_78._8_8_ = (xml_attribute_struct *)stack->result;
    local_78._0_8_ = xVar26._root;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_78);
    eval_string((xpath_string *)local_60,this->_right,c,(xpath_stack *)local_78);
    uVar5 = local_60._0_8_;
    pcVar17 = strstr((char *)local_a8,(char *)local_60._0_8_);
    if (pcVar17 == (char *)0x0) {
      __return_storage_ptr__->_buffer = "";
LAB_003868d5:
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      if (local_60[8] != true) {
        local_50 = strlength((char_t *)uVar5);
      }
      if (xStack_a0._attr._0_1_ != true) {
        local_98 = (xml_attribute_struct *)strlength((char_t *)local_a8);
      }
      if (xStack_a0._attr._0_1_ != true) {
        __return_storage_ptr__->_buffer = pcVar17 + local_50;
        goto LAB_003868d5;
      }
      xpath_string::from_heap
                (__return_storage_ptr__,pcVar17 + local_50,
                 (char_t *)
                 ((long)&((xml_node *)&local_98->header)->_root + (long)(uintptr_t *)local_a8),
                 stack->result);
    }
    pxVar2 = (xpath_memory_block *)(xVar26._root)->header;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    goto LAB_003868fb;
  case '&':
    xVar26._root = (xml_node_struct *)stack->temp;
    pxVar22 = (xpath_memory_block *)(xVar26._root)->header;
    pcVar11 = (xVar26._root)->name;
    local_60._8_8_ = (xml_attribute_struct *)stack->result;
    local_60._0_8_ = xVar26._root;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
    pxVar10 = local_98;
    if (xStack_a0._attr._0_1_ != true) {
      pxVar10 = (xml_attribute_struct *)strlength((char_t *)local_a8);
    }
    dVar33 = eval_number(this->_right,c,stack);
    local_78._0_8_ = floor(dVar33 + 0.5);
    puVar27 = (undefined1 *)((long)&((xml_node *)&pxVar10->header)->_root + 1);
    auVar36._8_4_ = (int)((ulong)puVar27 >> 0x20);
    auVar36._0_8_ = puVar27;
    auVar36._12_4_ = 0x45300000;
    if ((auVar36._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)puVar27) - 4503599627370496.0) <= (double)local_78._0_8_)
    {
      __return_storage_ptr__->_buffer = "";
    }
    else {
      xVar35._root = (xml_node_struct *)0x3ff0000000000000;
      if (1.0 <= (double)local_78._0_8_) {
        xVar35._root = (xml_node_struct *)local_78._0_8_;
      }
      uVar14 = (long)((double)xVar35._root - 9.223372036854776e+18) &
               (long)(double)xVar35._root >> 0x3f | (long)(double)xVar35._root;
      if (puVar27 <= (undefined1 *)(uVar14 - 1)) {
        __assert_fail("1 <= pos && pos <= s_length + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2ab6,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      if (xStack_a0._attr._0_1_ != true) {
        local_98 = (xml_attribute_struct *)strlength((char_t *)local_a8);
      }
      begin = (char_t *)((long)local_a8 + (uVar14 - 1));
      if (xStack_a0._attr._0_1_ == true) {
        xpath_string::from_heap
                  (__return_storage_ptr__,begin,
                   (char_t *)
                   ((long)&((xml_node *)&local_98->header)->_root + (long)(uintptr_t *)local_a8),
                   stack->result);
        goto LAB_00386703;
      }
      __return_storage_ptr__->_buffer = begin;
    }
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
LAB_00386703:
    pxVar2 = (xpath_memory_block *)(xVar26._root)->header;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    (xVar26._root)->header = (uintptr_t)pxVar22;
    (xVar26._root)->name = pcVar11;
    return __return_storage_ptr__;
  case '\'':
    xVar26._root = (xml_node_struct *)stack->temp;
    pxVar22 = (xpath_memory_block *)(xVar26._root)->header;
    local_b0 = (xVar26._root)->name;
    local_60._8_8_ = (xml_attribute_struct *)stack->result;
    local_60._0_8_ = xVar26._root;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
    pxVar10 = local_98;
    if (xStack_a0._attr._0_1_ != true) {
      pxVar10 = (xml_attribute_struct *)strlength((char_t *)local_a8);
    }
    dVar33 = eval_number(this->_right,c,stack);
    local_88._root = (xml_node_struct *)floor(dVar33 + 0.5);
    dVar33 = eval_number(this->_right->_next,c,stack);
    dVar33 = floor(dVar33 + 0.5);
    local_78._0_8_ = local_88._root;
    if (NAN((double)local_88._root)) {
LAB_003865e9:
      __return_storage_ptr__->_buffer = "";
LAB_003865f9:
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      local_78._0_8_ = dVar33 + (double)local_88._root;
      if (NAN((double)local_78._0_8_)) goto LAB_003865e9;
      puVar27 = (undefined1 *)((long)&((xml_node *)&pxVar10->header)->_root + 1);
      auVar37._8_4_ = (int)((ulong)puVar27 >> 0x20);
      auVar37._0_8_ = puVar27;
      auVar37._12_4_ = 0x45300000;
      dVar33 = (auVar37._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)puVar27) - 4503599627370496.0);
      if (((dVar33 <= (double)local_88._root) || ((double)local_78._0_8_ <= (double)local_88._root))
         || ((double)local_78._0_8_ < 1.0)) goto LAB_003865e9;
      xVar35._root = (xml_node_struct *)0x3ff0000000000000;
      if (1.0 <= (double)local_88._root) {
        xVar35._root = local_88._root;
      }
      uVar14 = (long)((double)xVar35._root - 9.223372036854776e+18) &
               (long)(double)xVar35._root >> 0x3f | (long)(double)xVar35._root;
      puVar15 = (undefined1 *)
                ((long)(double)local_78._0_8_ >> 0x3f &
                 (long)((double)local_78._0_8_ - 9.223372036854776e+18) |
                (long)(double)local_78._0_8_);
      if (dVar33 <= (double)local_78._0_8_) {
        puVar15 = puVar27;
      }
      if ((puVar15 <= (undefined1 *)(uVar14 - 1)) || (puVar27 < puVar15)) {
        __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2ad2,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      pcVar11 = (char_t *)((long)local_a8 + (uVar14 - 1));
      if ((puVar15 == puVar27) && (xStack_a0._attr._0_1_ == false)) {
        __return_storage_ptr__->_buffer = pcVar11;
        goto LAB_003865f9;
      }
      xpath_string::from_heap
                (__return_storage_ptr__,pcVar11,
                 puVar15 + (long)((long)&((xml_node_struct *)((long)local_a8 + -0x40))->
                                         first_attribute + 7),stack->result);
    }
    pxVar2 = (xpath_memory_block *)(xVar26._root)->header;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
LAB_003868fb:
    (xVar26._root)->header = (uintptr_t)pxVar22;
LAB_00386903:
    (xVar26._root)->name = local_b0;
    return __return_storage_ptr__;
  case '*':
    string_value((xpath_string *)local_a8,&c->n,stack->result);
    goto LAB_00386237;
  case '+':
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
LAB_00386237:
    pbVar12 = (byte *)xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pbVar12 == (byte *)0x0) goto LAB_00386cfc;
    pbVar28 = (byte *)normalize_space((char_t *)pbVar12);
    goto LAB_0038640d;
  case ',':
    pxVar18 = stack->temp;
    pxVar22 = pxVar18->_root;
    local_88._root = (xml_node_struct *)pxVar18->_root_size;
    local_40.temp = stack->result;
    local_40.result = pxVar18;
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    eval_string((xpath_string *)local_60,this->_right,c,&local_40);
    eval_string((xpath_string *)local_78,this->_right->_next,c,&local_40);
    pdVar9 = (double *)xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pdVar9 == (double *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
      goto LAB_0038697a;
    }
    if (local_78[8] != true) {
      local_68 = strlength((char_t *)local_78._0_8_);
    }
    cVar25 = *(char *)pdVar9;
    pdVar3 = pdVar9;
    local_80 = pdVar9;
    if (cVar25 != '\0') goto LAB_0038692d;
    goto LAB_00386961;
  case ':':
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    pbVar12 = (byte *)xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pbVar12 != (byte *)0x0) {
      bVar24 = *pbVar12;
      pbVar28 = pbVar12;
      if (bVar24 != 0) {
        pcVar11 = (this->_data).string;
        pbVar19 = pbVar12;
        do {
          pbVar19 = pbVar19 + 1;
          if ((char)bVar24 < '\0') {
            *pbVar28 = bVar24;
            pbVar28 = pbVar28 + 1;
          }
          else {
            bVar24 = pcVar11[bVar24];
            *pbVar28 = bVar24;
            pbVar28 = pbVar28 + (-1 < (char)bVar24);
          }
          bVar24 = *pbVar19;
        } while (bVar24 != 0);
      }
      *pbVar28 = 0;
      goto LAB_0038640d;
    }
    goto LAB_00386cfc;
  }
  goto LAB_00386d03;
LAB_0038692d:
  pcVar17 = strchr((char *)local_60._0_8_,(int)cVar25);
  if (pcVar17 == (char *)0x0) {
LAB_0038694f:
    *(char *)pdVar9 = cVar25;
    pdVar9 = (double *)((long)pdVar9 + 1);
  }
  else if ((ulong)((long)pcVar17 - local_60._0_8_) < local_68) {
    cVar25 = *(char_t *)(local_78._0_8_ + ((long)pcVar17 - local_60._0_8_));
    goto LAB_0038694f;
  }
  cVar25 = *(char *)((long)pdVar3 + 1);
  pdVar3 = (double *)((long)pdVar3 + 1);
  if (cVar25 == '\0') {
LAB_00386961:
    *(char_t *)pdVar9 = '\0';
    xpath_string::from_heap_preallocated(__return_storage_ptr__,(char_t *)local_80,(char_t *)pdVar9)
    ;
LAB_0038697a:
    pxVar2 = pxVar18->_root;
    while (pxVar2 != pxVar22) {
      pxVar2 = pxVar2->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar18->_root = pxVar22;
    pxVar18->_root_size = (size_t)local_88._root;
    return __return_storage_ptr__;
  }
  goto LAB_0038692d;
switchD_00385e0c_caseD_20:
  this = this->_left;
  goto LAB_00385df4;
  while (pbVar29 = pbVar12 + -1, pbVar28 = pbVar12, pbVar12 = pbVar12 + -1, *pbVar29 == 0x30) {
LAB_00386c42:
    pbVar28 = pbVar19;
    if (pbVar12 == pbVar19) break;
  }
  uVar20 = iVar7 + 1;
  *pbVar28 = 0;
  sVar13 = strlen(local_a8);
  uVar4 = -uVar20;
  if (0 < (int)uVar20) {
    uVar4 = uVar20;
  }
  sVar32 = uVar4 + sVar13 + 4;
  pbVar12 = (byte *)xpath_allocator::allocate(pxVar18,sVar32);
  if (pbVar12 != (byte *)0x0) {
    pbVar28 = pbVar12;
    if ((double)pxVar34 < 0.0) {
      pbVar28 = pbVar12 + 1;
      *pbVar12 = 0x2d;
    }
    if (iVar7 < 0) {
      *pbVar28 = 0x30;
      pbVar28 = pbVar28 + 1;
    }
    else {
      iVar7 = iVar7 + 2;
      do {
        bVar24 = *pbVar19;
        if (9 < (int)(char)bVar24 - 0x30U && bVar24 != 0) {
          __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x213e,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        bVar6 = bVar24 != 0;
        if (!bVar6) {
          bVar24 = 0x30;
        }
        pbVar19 = pbVar19 + bVar6;
        *pbVar28 = bVar24;
        pbVar28 = pbVar28 + 1;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      uVar20 = 0;
    }
    if (*pbVar19 != 0) {
      *pbVar28 = 0x2e;
      pbVar29 = pbVar28 + 1;
      if ((int)uVar20 < 0) {
        memset(pbVar29,0x30,(ulong)-uVar20);
        pbVar29 = pbVar28 + (1 - uVar20);
      }
      bVar24 = *pbVar19;
      pbVar28 = pbVar29;
      while (bVar24 != 0) {
        pbVar19 = pbVar19 + 1;
        if (9 < (int)(char)bVar24 - 0x30U) {
          __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x2154,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        *pbVar28 = bVar24;
        pbVar28 = pbVar28 + 1;
        bVar24 = *pbVar19;
      }
    }
    if (pbVar12 + sVar32 <= pbVar28) {
      __assert_fail("s < result + result_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x215a,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
    *pbVar28 = 0;
LAB_0038640d:
    xpath_string::from_heap_preallocated(__return_storage_ptr__,(char_t *)pbVar12,(char_t *)pbVar28)
    ;
    return __return_storage_ptr__;
  }
LAB_00386cfc:
  pcVar17 = "";
LAB_00386d03:
  __return_storage_ptr__->_buffer = pcVar17;
LAB_00386d07:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}